

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>::dispose
          (Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_> *this)

{
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder> *pOVar1;
  size_t sVar2;
  
  pOVar1 = this->ptr;
  if (pOVar1 != (Own<kj::(anonymous_namespace)::DestructionOrderRecorder> *)0x0) {
    sVar2 = this->size_;
    this->ptr = (Own<kj::(anonymous_namespace)::DestructionOrderRecorder> *)0x0;
    this->size_ = 0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pOVar1,0x10,sVar2,sVar2,
               ArrayDisposer::
               Dispose_<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>,_false>::
               destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    size_t sizeCopy = size_;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      size_ = 0;
      disposer->dispose(ptrCopy, sizeCopy, sizeCopy);
    }
  }